

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::layout_for_member_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t id;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  CompilerError *pCVar5;
  uint *ts_1;
  bool local_309;
  string local_2e8;
  allocator local_2c2;
  undefined1 local_2c1;
  undefined4 local_2c0;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  string local_230;
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  Bitset flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  uint32_t local_17c;
  undefined1 local_178 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Decoration *dec;
  VectorView<diligent_spirv_cross::Meta::Decoration> *local_50;
  Vector<Decoration> *memb;
  uint32_t local_40;
  uint32_t local_3c;
  bool local_35;
  bool is_block;
  allocator local_25;
  uint32_t local_24;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_24 = index;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar1 = is_legacy(this);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    local_3c = (pSStack_20->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_3c,Block);
    local_309 = true;
    if (!bVar1) {
      local_40 = (pSStack_20->super_IVariant).self.id;
      local_309 = Compiler::has_decoration(&this->super_Compiler,(ID)local_40,BufferBlock);
    }
    local_35 = local_309;
    if (local_309 == false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)((long)&memb + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&memb + 7));
    }
    else {
      pmVar2 = ::std::
               unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
      local_50 = &(pmVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>;
      uVar3 = (ulong)local_24;
      sVar4 = VectorView<diligent_spirv_cross::Meta::Decoration>::size(local_50);
      if (uVar3 < sVar4) {
        attr.stack_storage.aligned_char._248_8_ =
             VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                       (local_50,(ulong)local_24);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178);
        local_17c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar1 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)local_17c,local_24,DecorationPassthroughNV)
        ;
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1a0,"passthrough",
                     (allocator *)((long)&flags.higher._M_h._M_single_bucket + 7));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&flags.higher._M_h._M_single_bucket + 7));
        }
        ts_1 = (uint *)(ulong)local_24;
        Compiler::combined_decoration_for_member
                  ((Bitset *)local_1e8,&this->super_Compiler,pSStack_20,local_24);
        bVar1 = Bitset::get((Bitset *)local_1e8,4);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_208,"row_major",&local_209);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_208);
          ::std::__cxx11::string::~string((string *)&local_208);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x1e);
        if ((bVar1) && (bVar1 = can_use_io_location(this,pSStack_20->storage,true), bVar1)) {
          join<char_const(&)[12],unsigned_int&>
                    (&local_230,(diligent_spirv_cross *)0xe6f13e,
                     (char (*) [12])(attr.stack_storage.aligned_char._248_8_ + 0xc4),ts_1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_230);
          ::std::__cxx11::string::~string((string *)&local_230);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x1f);
        if ((bVar1) && (bVar1 = can_use_io_location(this,pSStack_20->storage,true), bVar1)) {
          if (((this->options).es & 1U) != 0) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Component decoration is not supported in ES targets.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((this->options).version < 0x1b8) && (0x8b < (this->options).version)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_250,"GL_ARB_enhanced_layouts",&local_251);
            require_extension_internal(this,&local_250);
            ::std::__cxx11::string::~string((string *)&local_250);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
          }
          else if ((this->options).version < 0x8c) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Component decoration is not supported in targets below GLSL 1.40.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          join<char_const(&)[13],unsigned_int&>
                    (&local_278,(diligent_spirv_cross *)"component = ",
                     (char (*) [13])(attr.stack_storage.aligned_char._248_8_ + 200),ts_1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_278);
          ::std::__cxx11::string::~string((string *)&local_278);
        }
        id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
        bVar1 = Compiler::has_extended_decoration
                          (&this->super_Compiler,id,SPIRVCrossDecorationExplicitOffset);
        if ((bVar1) &&
           (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x23),
           bVar1)) {
          join<char_const(&)[10],unsigned_int&>
                    (&local_298,(diligent_spirv_cross *)0xf60481,
                     (char (*) [10])(attr.stack_storage.aligned_char._248_8_ + 0xd4),ts_1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_298);
          ::std::__cxx11::string::~string((string *)&local_298);
        }
        else if ((pSStack_20->storage == Output) &&
                (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x80),0x23
                                    ), bVar1)) {
          join<char_const(&)[14],unsigned_int&>
                    (&local_2b8,(diligent_spirv_cross *)0xf6047d,
                     (char (*) [14])(attr.stack_storage.aligned_char._248_8_ + 0xd4),ts_1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_178,&local_2b8);
          ::std::__cxx11::string::~string((string *)&local_2b8);
        }
        bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_178);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2b9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        }
        else {
          local_2c1 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"layout(",&local_2c2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2c2);
          diligent_spirv_cross::merge
                    (&local_2e8,
                     (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_178,", ");
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2e8);
          ::std::__cxx11::string::~string((string *)&local_2e8);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,") ");
          local_2c1 = 1;
        }
        local_2c0 = 1;
        Bitset::~Bitset((Bitset *)local_1e8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_178);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"",(allocator *)((long)&dec + 7));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&dec + 7));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	if (is_legacy())
		return "";

	bool is_block = has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
	if (!is_block)
		return "";

	auto &memb = ir.meta[type.self].members;
	if (index >= memb.size())
		return "";
	auto &dec = memb[index];

	SmallVector<string> attr;

	if (has_member_decoration(type.self, index, DecorationPassthroughNV))
		attr.push_back("passthrough");

	// We can only apply layouts on members in block interfaces.
	// This is a bit problematic because in SPIR-V decorations are applied on the struct types directly.
	// This is not supported on GLSL, so we have to make the assumption that if a struct within our buffer block struct
	// has a decoration, it was originally caused by a top-level layout() qualifier in GLSL.
	//
	// We would like to go from (SPIR-V style):
	//
	// struct Foo { layout(row_major) mat4 matrix; };
	// buffer UBO { Foo foo; };
	//
	// to
	//
	// struct Foo { mat4 matrix; }; // GLSL doesn't support any layout shenanigans in raw struct declarations.
	// buffer UBO { layout(row_major) Foo foo; }; // Apply the layout on top-level.
	auto flags = combined_decoration_for_member(type, index);

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	// We don't emit any global layouts, so column_major is default.
	//if (flags & (1ull << DecorationColMajor))
	//    attr.push_back("column_major");

	if (dec.decoration_flags.get(DecorationLocation) && can_use_io_location(type.storage, true))
		attr.push_back(join("location = ", dec.location));

	// Can only declare component if we can declare location.
	if (dec.decoration_flags.get(DecorationComponent) && can_use_io_location(type.storage, true))
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
			attr.push_back(join("component = ", dec.component));
		}
		else
			SPIRV_CROSS_THROW("Component decoration is not supported in ES targets.");
	}

	// SPIRVCrossDecorationPacked is set by layout_for_variable earlier to mark that we need to emit offset qualifiers.
	// This is only done selectively in GLSL as needed.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) &&
	    dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("offset = ", dec.offset));
	else if (type.storage == StorageClassOutput && dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("xfb_offset = ", dec.offset));

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}